

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

char * __thiscall TadsHttpReqResult::find_header(TadsHttpReqResult *this,char *name)

{
  int iVar1;
  size_t len;
  char *p;
  
  len = strlen(name);
  p = this->hdrs;
  do {
    if (p == (char *)0x0) {
      return (char *)0x0;
    }
    while ((*p != '\0' && (iVar1 = is_space((int)*p), iVar1 != 0))) {
      p = p + 1;
    }
    iVar1 = memicmp(p,name,len);
    if (iVar1 == 0) {
      for (p = p + len; *p != '\0'; p = p + 1) {
        iVar1 = is_space((int)*p);
        if (iVar1 == 0) {
          if (*p == ':') {
            do {
              p = p + 1;
              if (*p == '\0') {
                return p;
              }
              iVar1 = is_space((int)*p);
            } while (iVar1 != 0);
            return p;
          }
          break;
        }
      }
    }
    p = next_header(this,p);
  } while( true );
}

Assistant:

const char *find_header(const char *name)
    {
        /* remember the name length */
        size_t namelen = strlen(name);

        /* scan the headers */
        for (const char *p = hdrs ; p != 0 ; p = next_header(p))
        {
            /* skip spaces */
            for ( ; *p != '\0' && is_space(*p) ; ++p) ;

            /* check for a match */
            if (memicmp(p, name, namelen) == 0)
            {
                /* skip the name and any subsequent spaces */
                for (p += namelen ; *p != '\0' && is_space(*p) ; ++p) ;

                /* make sure we have a ':' */
                if (*p == ':')
                {
                    /* skip the ':' and subsequent spaces */
                    for (p += 1 ; *p != '\0' && is_space(*p) ; ++p) ;

                    /* this is the start of the header value */
                    return p;
                }
            }
        }

        /* didn't find it */
        return 0;
    }